

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int StartThreadRazorAHRSx(RAZORAHRS *pRazorAHRS)

{
  int iVar1;
  long lVar2;
  CRITICAL_SECTION *pCriticalSection;
  THREAD_IDENTIFIER *pThreadId;
  
  pCriticalSection = RazorAHRSCS;
  pThreadId = RazorAHRSThreadId;
  lVar2 = 0;
  do {
    if (*(RAZORAHRS **)((long)addrsRazorAHRS + lVar2 * 2) == pRazorAHRS) {
      *(undefined4 *)((long)resRazorAHRS + lVar2) = 1;
      *(undefined4 *)((long)bExitRazorAHRS + lVar2) = 0;
      razorahrsdataRazorAHRS[0].yaw = 0.0;
      razorahrsdataRazorAHRS[0].pitch = 0.0;
      razorahrsdataRazorAHRS[0].roll = 0.0;
      razorahrsdataRazorAHRS[0].accx = 0.0;
      razorahrsdataRazorAHRS[0].accy = 0.0;
      razorahrsdataRazorAHRS[0].accz = 0.0;
      razorahrsdataRazorAHRS[0].gyrx = 0.0;
      razorahrsdataRazorAHRS[0].gyry = 0.0;
      razorahrsdataRazorAHRS[0].gyrz = 0.0;
      razorahrsdataRazorAHRS[0].Roll = 0.0;
      razorahrsdataRazorAHRS[0].Pitch = 0.0;
      razorahrsdataRazorAHRS[0].Yaw = 0.0;
      InitCriticalSection(pCriticalSection);
      iVar1 = CreateDefaultThread(RazorAHRSThread,pRazorAHRS,pThreadId);
      return iVar1;
    }
    lVar2 = lVar2 + 4;
    pCriticalSection = pCriticalSection + 1;
    pThreadId = pThreadId + 1;
  } while (lVar2 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int StartThreadRazorAHRSx(RAZORAHRS* pRazorAHRS)
{
	int id = 0;

	while (addrsRazorAHRS[id] != pRazorAHRS)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	resRazorAHRS[id] = EXIT_FAILURE;
	bExitRazorAHRS[id] = FALSE;
	memset(&razorahrsdataRazorAHRS, 0, sizeof(RAZORAHRSDATA));
	InitCriticalSection(&RazorAHRSCS[id]);
	return CreateDefaultThread(RazorAHRSThread, (void*)pRazorAHRS, &RazorAHRSThreadId[id]);
}